

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Vfs_file_ctime(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  jx9_value *pObj;
  char *pcVar2;
  jx9_real jVar3;
  uint uVar4;
  
  uVar4 = 8;
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jVar3 = 0.0;
  }
  else {
    pvVar1 = pCtx->pFunc->pUserData;
    if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0xa8) == 0)) {
      jVar3 = 0.0;
      jx9_context_throw_error_format
                (pCtx,2,
                 "IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE",
                 (pCtx->pFunc->sName).zString);
    }
    else {
      pcVar2 = jx9_value_to_string(*apArg,(int *)0x0);
      jVar3 = (jx9_real)(**(code **)((long)pvVar1 + 0xa8))(pcVar2);
      uVar4 = 2;
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar3;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | uVar4;
  return 0;
}

Assistant:

static int jx9Vfs_file_ctime(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath;
	jx9_int64 iTime;
	jx9_vfs *pVfs;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xFileCtime == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the desired directory */
	zPath = jx9_value_to_string(apArg[0], 0);
	/* Perform the requested operation */
	iTime = pVfs->xFileCtime(zPath);
	/* IO return value */
	jx9_result_int64(pCtx, iTime);
	return JX9_OK;
}